

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall CoreML::NeuralNetworkShaper::print(NeuralNetworkShaper *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Network Shapes: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    ::operator<<((ostream *)&std::cout,(ShapeConstraint *)(p_Var2 + 2));
  }
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void NeuralNetworkShaper::print() const {

    std::cout << "Network Shapes: " << std::endl;
    for (auto ind = blobShapes.begin(); ind != blobShapes.end(); ind++) {
        std::cout << ind->second;
    }
    std::cout << std::endl << std::endl;

}